

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  pointer puVar5;
  pointer puVar6;
  pointer pdVar7;
  pointer pEVar8;
  pointer pdVar9;
  pointer pdVar10;
  iterator __position;
  undefined4 *puVar11;
  undefined4 *puVar12;
  long lVar13;
  long lVar14;
  undefined4 *puVar15;
  ulong uVar16;
  vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
  *this;
  EditType EVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 local_98 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  undefined1 local_78 [8];
  EditType move;
  vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
  *local_60;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  *best_path;
  undefined1 local_50 [8];
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_60 = (vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
              *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_50,
             ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_98,((long)puVar6 - (long)puVar5 >> 3) + 1,(value_type *)local_50,
           (allocator_type *)
           ((long)&best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (local_50 != (undefined1  [8])0x0) {
    operator_delete((void *)local_50);
  }
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            *)local_78,
           ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start >> 3) + 1,
           (allocator_type *)
           ((long)&best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
            *)local_50,((long)puVar6 - (long)puVar5 >> 3) + 1,(value_type *)local_78,
           (allocator_type *)
           ((long)&best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  this = local_60;
  if ((void *)CONCAT44(local_78._4_4_,local_78._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_78._4_4_,local_78._0_4_));
  }
  if ((long)costs.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start - (long)local_98 != 0) {
    lVar13 = ((long)costs.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)local_98 >> 3) *
             -0x5555555555555555;
    lVar18 = 0;
    lVar19 = 0;
    do {
      auVar21._8_4_ = (int)((ulong)lVar19 >> 0x20);
      auVar21._0_8_ = lVar19;
      auVar21._12_4_ = 0x45300000;
      **(double **)
        ((long)&(((_Vector_base<double,_std::allocator<double>_> *)local_98)->_M_impl).
                super__Vector_impl_data._M_start + lVar18) =
           (auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
      **(undefined4 **)
        ((long)&(((_Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                   *)local_50)->_M_impl).super__Vector_impl_data._M_start + lVar18) = 2;
      lVar19 = lVar19 + 1;
      lVar18 = lVar18 + 0x18;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar19);
  }
  pdVar7 = (((_Vector_base<double,_std::allocator<double>_> *)local_98)->_M_impl).
           super__Vector_impl_data._M_start;
  uVar16 = (long)(((_Vector_base<double,_std::allocator<double>_> *)local_98)->_M_impl).
                 super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
  if (1 < uVar16) {
    pEVar8 = (((_Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                *)local_50)->_M_impl).super__Vector_impl_data._M_start;
    uVar20 = 1;
    do {
      auVar22._8_4_ = (int)(uVar20 >> 0x20);
      auVar22._0_8_ = uVar20;
      auVar22._12_4_ = 0x45300000;
      pdVar7[uVar20] =
           (auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
      pEVar8[uVar20] = kAdd;
      uVar20 = uVar20 + 1;
    } while (uVar16 != uVar20);
  }
  best_path = (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               *)(left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  costs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish;
  lVar13 = (long)costs.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)best_path >> 3;
  puVar5 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (costs.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)best_path) {
    lVar18 = (long)puVar6 - (long)puVar5 >> 3;
    lVar19 = 0;
    do {
      if (puVar6 != puVar5) {
        pdVar7 = (&(((pointer)best_path)->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start)[lVar19];
        pEVar8 = (((pointer)((long)local_50 + (lVar19 + 1) * 0x18))->
                 super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar14 = 0;
        do {
          if (pdVar7 == (pointer)puVar5[lVar14]) {
            (((pointer)((long)local_98 + (lVar19 + 1) * 0x18))->
            super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
            _M_start[lVar14 + 1] =
                 (((pointer)((long)local_98 + lVar19 * 0x18))->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar14];
            EVar17 = kMatch;
          }
          else {
            pdVar9 = (((pointer)((long)local_98 + (lVar19 + 1) * 0x18))->
                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar1 = pdVar9[lVar14];
            pdVar10 = (((pointer)((long)local_98 + lVar19 * 0x18))->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar2 = pdVar10[lVar14];
            dVar3 = pdVar10[lVar14 + 1];
            if ((dVar3 <= dVar1) || (dVar2 <= dVar1)) {
              if ((dVar1 <= dVar3) || (dVar2 <= dVar3)) {
                pdVar9[lVar14 + 1] = dVar2 + 1.00001;
                EVar17 = kReplace;
              }
              else {
                pdVar9[lVar14 + 1] = dVar3 + 1.0;
                EVar17 = kRemove;
              }
            }
            else {
              pdVar9[lVar14 + 1] = dVar1 + 1.0;
              EVar17 = kAdd;
            }
          }
          pEVar8[lVar14 + 1] = EVar17;
          lVar14 = lVar14 + 1;
          this = local_60;
        } while (lVar18 + (ulong)(lVar18 == 0) != lVar14);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar13 + (ulong)(lVar13 == 0));
  }
  *(undefined1 (*) [16])this = (undefined1  [16])0x0;
  *(undefined8 *)(this + 0x10) = 0;
  if (puVar6 != puVar5 ||
      costs.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)best_path) {
    lVar18 = (long)puVar6 - (long)puVar5 >> 3;
    do {
      local_78._0_4_ =
           (((pointer)((long)local_50 + lVar13 * 0x18))->
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar18];
      __position._M_current = *(EditType **)(this + 8);
      if (__position._M_current == *(EditType **)(this + 0x10)) {
        std::
        vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
        ::_M_realloc_insert<testing::internal::edit_distance::EditType_const&>
                  (this,__position,(EditType *)local_78);
      }
      else {
        *__position._M_current = local_78._0_4_;
        *(EditType **)(this + 8) = __position._M_current + 1;
      }
      lVar13 = lVar13 - (ulong)(local_78._0_4_ != kAdd);
      lVar18 = lVar18 - (ulong)(local_78._0_4_ != kRemove);
    } while (lVar13 != 0 || lVar18 != 0);
    puVar11 = *(undefined4 **)this;
    puVar15 = *(undefined4 **)(this + 8) + -1;
    if (puVar11 < puVar15 && puVar11 != *(undefined4 **)(this + 8)) {
      do {
        puVar12 = puVar11 + 1;
        uVar4 = *puVar11;
        *puVar11 = *puVar15;
        *puVar15 = uVar4;
        puVar15 = puVar15 + -1;
        puVar11 = puVar12;
      } while (puVar12 < puVar15);
    }
  }
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             *)local_50);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_98);
  return (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          *)this;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}